

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_64x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  int iVar42;
  uint8_t *puVar43;
  bool bVar44;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar45 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar46 [16];
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  __m128i l16;
  __m128i dl;
  __m128i ch;
  __m128i cl;
  __m128i bh;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i tl16;
  __m128i dh;
  
  auVar45 = *(undefined1 (*) [16])above;
  auVar46 = *(undefined1 (*) [16])(above + 0x10);
  auVar1 = *(undefined1 (*) [16])(above + 0x20);
  auVar2 = *(undefined1 (*) [16])(above + 0x30);
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar45._0_13_;
  auVar3[0xe] = auVar45[7];
  auVar7[0xc] = auVar45[6];
  auVar7._0_12_ = auVar45._0_12_;
  auVar7._13_2_ = auVar3._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar45._0_11_;
  auVar11._12_3_ = auVar7._12_3_;
  auVar15[10] = auVar45[5];
  auVar15._0_10_ = auVar45._0_10_;
  auVar15._11_4_ = auVar11._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar45._0_9_;
  auVar19._10_5_ = auVar15._10_5_;
  auVar23[8] = auVar45[4];
  auVar23._0_8_ = auVar45._0_8_;
  auVar23._9_6_ = auVar19._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar23._8_7_;
  auVar34._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar34[0] = auVar45[3];
  auVar34._9_6_ = 0;
  auVar35._1_10_ = SUB1510(auVar34 << 0x30,5);
  auVar35[0] = auVar45[2];
  auVar35._11_4_ = 0;
  auVar27[2] = auVar45[1];
  auVar27._0_2_ = auVar45._0_2_;
  auVar27._3_12_ = SUB1512(auVar35 << 0x20,3);
  al[0]._0_2_ = auVar45._0_2_ & 0xff;
  al._2_13_ = auVar27._2_13_;
  al[1]._7_1_ = 0;
  ah[0] = (ulong)CONCAT16(auVar45[0xb],
                          (uint6)CONCAT14(auVar45[10],(uint)CONCAT12(auVar45[9],(ushort)auVar45[8]))
                         );
  ah[1]._0_1_ = auVar45[0xc];
  ah[1]._1_1_ = 0;
  ah[1]._2_1_ = auVar45[0xd];
  ah[1]._3_1_ = 0;
  ah[1]._4_1_ = auVar45[0xe];
  ah[1]._5_1_ = 0;
  ah[1]._6_1_ = auVar45[0xf];
  ah[1]._7_1_ = 0;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar46._0_13_;
  auVar4[0xe] = auVar46[7];
  auVar8[0xc] = auVar46[6];
  auVar8._0_12_ = auVar46._0_12_;
  auVar8._13_2_ = auVar4._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar46._0_11_;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16[10] = auVar46[5];
  auVar16._0_10_ = auVar46._0_10_;
  auVar16._11_4_ = auVar12._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar46._0_9_;
  auVar20._10_5_ = auVar16._10_5_;
  auVar24[8] = auVar46[4];
  auVar24._0_8_ = auVar46._0_8_;
  auVar24._9_6_ = auVar20._9_6_;
  auVar31._7_8_ = 0;
  auVar31._0_7_ = auVar24._8_7_;
  auVar36._1_8_ = SUB158(auVar31 << 0x40,7);
  auVar36[0] = auVar46[3];
  auVar36._9_6_ = 0;
  auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
  auVar37[0] = auVar46[2];
  auVar37._11_4_ = 0;
  auVar28[2] = auVar46[1];
  auVar28._0_2_ = auVar46._0_2_;
  auVar28._3_12_ = SUB1512(auVar37 << 0x20,3);
  bl[0]._0_2_ = auVar46._0_2_ & 0xff;
  bl._2_13_ = auVar28._2_13_;
  bl[1]._7_1_ = 0;
  bh[0] = (ulong)CONCAT16(auVar46[0xb],
                          (uint6)CONCAT14(auVar46[10],(uint)CONCAT12(auVar46[9],(ushort)auVar46[8]))
                         );
  bh[1]._0_1_ = auVar46[0xc];
  bh[1]._1_1_ = 0;
  bh[1]._2_1_ = auVar46[0xd];
  bh[1]._3_1_ = 0;
  bh[1]._4_1_ = auVar46[0xe];
  bh[1]._5_1_ = 0;
  bh[1]._6_1_ = auVar46[0xf];
  bh[1]._7_1_ = 0;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar1._0_13_;
  auVar5[0xe] = auVar1[7];
  auVar9[0xc] = auVar1[6];
  auVar9._0_12_ = auVar1._0_12_;
  auVar9._13_2_ = auVar5._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar1._0_11_;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17[10] = auVar1[5];
  auVar17._0_10_ = auVar1._0_10_;
  auVar17._11_4_ = auVar13._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar1._0_9_;
  auVar21._10_5_ = auVar17._10_5_;
  auVar25[8] = auVar1[4];
  auVar25._0_8_ = auVar1._0_8_;
  auVar25._9_6_ = auVar21._9_6_;
  auVar32._7_8_ = 0;
  auVar32._0_7_ = auVar25._8_7_;
  auVar38._1_8_ = SUB158(auVar32 << 0x40,7);
  auVar38[0] = auVar1[3];
  auVar38._9_6_ = 0;
  auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
  auVar39[0] = auVar1[2];
  auVar39._11_4_ = 0;
  cl._3_12_ = SUB1512(auVar39 << 0x20,3);
  cl[0]._2_1_ = auVar1[1];
  cl[0]._0_2_ = (ushort)auVar1[0];
  cl[1]._7_1_ = 0;
  ch[0] = (ulong)CONCAT16(auVar1[0xb],
                          (uint6)CONCAT14(auVar1[10],(uint)CONCAT12(auVar1[9],(ushort)auVar1[8])));
  ch[1]._0_1_ = auVar1[0xc];
  ch[1]._1_1_ = 0;
  ch[1]._2_1_ = auVar1[0xd];
  ch[1]._3_1_ = 0;
  ch[1]._4_1_ = auVar1[0xe];
  ch[1]._5_1_ = 0;
  ch[1]._6_1_ = auVar1[0xf];
  ch[1]._7_1_ = 0;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar2._0_13_;
  auVar6[0xe] = auVar2[7];
  auVar10[0xc] = auVar2[6];
  auVar10._0_12_ = auVar2._0_12_;
  auVar10._13_2_ = auVar6._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar2._0_11_;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18[10] = auVar2[5];
  auVar18._0_10_ = auVar2._0_10_;
  auVar18._11_4_ = auVar14._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = auVar2._0_9_;
  auVar22._10_5_ = auVar18._10_5_;
  auVar26[8] = auVar2[4];
  auVar26._0_8_ = auVar2._0_8_;
  auVar26._9_6_ = auVar22._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar26._8_7_;
  auVar40._1_8_ = SUB158(auVar33 << 0x40,7);
  auVar40[0] = auVar2[3];
  auVar40._9_6_ = 0;
  auVar41._1_10_ = SUB1510(auVar40 << 0x30,5);
  auVar41[0] = auVar2[2];
  auVar41._11_4_ = 0;
  auVar29[2] = auVar2[1];
  auVar29._0_2_ = auVar2._0_2_;
  auVar29._3_12_ = SUB1512(auVar41 << 0x20,3);
  dl[0]._0_2_ = auVar2._0_2_ & 0xff;
  dl._2_13_ = auVar29._2_13_;
  dl[1]._7_1_ = 0;
  dh[0] = (ulong)CONCAT16(auVar2[0xb],
                          (uint6)CONCAT14(auVar2[10],(uint)CONCAT12(auVar2[9],(ushort)auVar2[8])));
  dh[1]._0_1_ = auVar2[0xc];
  dh[1]._1_1_ = 0;
  dh[1]._2_1_ = auVar2[0xd];
  dh[1]._3_1_ = 0;
  dh[1]._4_1_ = auVar2[0xe];
  dh[1]._5_1_ = 0;
  dh[1]._6_1_ = auVar2[0xf];
  dh[1]._7_1_ = 0;
  auVar45 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar45._0_4_;
  auVar45 = *(undefined1 (*) [16])left;
  puVar43 = dst + 0x30;
  iVar42 = 0x10;
  auVar46 = _DAT_00435e80;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar44 = iVar42 != 0, iVar42 = iVar42 + -1, bVar44) {
    l16 = (__m128i)pshufb(auVar45,auVar46);
    paeth_16x1_pred(&l16,&al,&ah,&tl16);
    paeth_16x1_pred(&l16,&bl,&bh,&tl16);
    paeth_16x1_pred(&l16,&cl,&ch,&tl16);
    paeth_16x1_pred(&l16,&dl,&dh,&tl16);
    local_e8 = auVar46._0_2_;
    sStack_e6 = auVar46._2_2_;
    sStack_e4 = auVar46._4_2_;
    sStack_e2 = auVar46._6_2_;
    sStack_e0 = auVar46._8_2_;
    sStack_de = auVar46._10_2_;
    sStack_dc = auVar46._12_2_;
    sStack_da = auVar46._14_2_;
    *(undefined8 *)(puVar43 + -0x30) = extraout_XMM0_Qa;
    *(undefined8 *)(puVar43 + -0x28) = extraout_XMM0_Qb;
    *(undefined8 *)(puVar43 + -0x20) = extraout_XMM0_Qa_00;
    *(undefined8 *)(puVar43 + -0x18) = extraout_XMM0_Qb_00;
    *(undefined8 *)(puVar43 + -0x10) = extraout_XMM0_Qa_01;
    *(undefined8 *)(puVar43 + -8) = extraout_XMM0_Qb_01;
    *(undefined8 *)puVar43 = extraout_XMM0_Qa_02;
    *(undefined8 *)(puVar43 + 8) = extraout_XMM0_Qb_02;
    auVar46._0_2_ = local_e8 + 1;
    auVar46._2_2_ = sStack_e6 + 1;
    auVar46._4_2_ = sStack_e4 + 1;
    auVar46._6_2_ = sStack_e2 + 1;
    auVar46._8_2_ = sStack_e0 + 1;
    auVar46._10_2_ = sStack_de + 1;
    auVar46._12_2_ = sStack_dc + 1;
    auVar46._14_2_ = sStack_da + 1;
    puVar43 = puVar43 + stride;
  }
  return;
}

Assistant:

void aom_paeth_predictor_64x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i c = _mm_load_si128((const __m128i *)(above + 32));
  const __m128i d = _mm_load_si128((const __m128i *)(above + 48));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);
  const __m128i cl = _mm_unpacklo_epi8(c, zero);
  const __m128i ch = _mm_unpackhi_epi8(c, zero);
  const __m128i dl = _mm_unpacklo_epi8(d, zero);
  const __m128i dh = _mm_unpackhi_epi8(d, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i;
  const __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r0 = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r1 = paeth_16x1_pred(&l16, &bl, &bh, &tl16);
    const __m128i r2 = paeth_16x1_pred(&l16, &cl, &ch, &tl16);
    const __m128i r3 = paeth_16x1_pred(&l16, &dl, &dh, &tl16);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);
    _mm_store_si128((__m128i *)(dst + 32), r2);
    _mm_store_si128((__m128i *)(dst + 48), r3);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}